

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

void __thiscall btLCP::transfer_i_from_N_to_C(btLCP *this,int i)

{
  int iVar1;
  long lVar2;
  int in_ESI;
  int *in_RDI;
  float fVar3;
  btScalar bVar4;
  int nC;
  int nC_1;
  int j_1;
  btScalar *d;
  btScalar *Dell_1;
  btScalar *ell;
  btScalar *Ltgt;
  int nC_3;
  int nC_2;
  int j;
  int nub;
  int *C;
  btScalar *Dell;
  btScalar *aptr;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  long lVar5;
  int in_stack_ffffffffffffff90;
  long lVar6;
  int in_stack_ffffffffffffff98;
  long lVar7;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  int local_50;
  
  if (in_RDI[3] < 1) {
    **(float **)(in_RDI + 0x14) =
         1.0 / *(float *)(*(long *)(*(long *)(in_RDI + 6) + (long)in_ESI * 8) + (long)in_ESI * 4);
  }
  else {
    lVar7 = *(long *)(*(long *)(in_RDI + 6) + (long)in_ESI * 8);
    lVar6 = *(long *)(in_RDI + 0x16);
    lVar5 = *(long *)(in_RDI + 0x22);
    iVar1 = in_RDI[2];
    for (local_50 = 0; local_50 < iVar1; local_50 = local_50 + 1) {
      *(undefined4 *)(lVar6 + (long)local_50 * 4) = *(undefined4 *)(lVar7 + (long)local_50 * 4);
    }
    iVar1 = in_RDI[3];
    for (; local_50 < iVar1; local_50 = local_50 + 1) {
      *(undefined4 *)(lVar6 + (long)local_50 * 4) =
           *(undefined4 *)(lVar7 + (long)*(int *)(lVar5 + (long)local_50 * 4) * 4);
    }
    btSolveL1(*(btScalar **)(in_RDI + 0x12),*(btScalar **)(in_RDI + 0x16),in_RDI[3],in_RDI[1]);
    in_stack_ffffffffffffffa8 = in_RDI[3];
    lVar2 = *(long *)(in_RDI + 0x12) + (long)(in_stack_ffffffffffffffa8 * in_RDI[1]) * 4;
    lVar7 = *(long *)(in_RDI + 0x18);
    lVar6 = *(long *)(in_RDI + 0x16);
    lVar5 = *(long *)(in_RDI + 0x14);
    for (in_stack_ffffffffffffff84 = 0; in_stack_ffffffffffffff84 < in_stack_ffffffffffffffa8;
        in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1) {
      fVar3 = *(float *)(lVar6 + (long)in_stack_ffffffffffffff84 * 4) *
              *(float *)(lVar5 + (long)in_stack_ffffffffffffff84 * 4);
      *(float *)(lVar7 + (long)in_stack_ffffffffffffff84 * 4) = fVar3;
      *(float *)(lVar2 + (long)in_stack_ffffffffffffff84 * 4) = fVar3;
    }
    in_stack_ffffffffffffff80 = in_RDI[3];
    fVar3 = *(float *)(*(long *)(*(long *)(in_RDI + 6) + (long)in_ESI * 8) + (long)in_ESI * 4);
    bVar4 = btLargeDot(*(btScalar **)(in_RDI + 0x18),*(btScalar **)(in_RDI + 0x16),
                       in_stack_ffffffffffffff80);
    in_stack_ffffffffffffffa0 = (int)lVar2;
    in_stack_ffffffffffffff98 = (int)lVar7;
    in_stack_ffffffffffffff90 = (int)lVar6;
    in_stack_ffffffffffffff88 = (int)lVar5;
    *(float *)(*(long *)(in_RDI + 0x14) + (long)in_stack_ffffffffffffff80 * 4) =
         1.0 / (fVar3 - bVar4);
  }
  btSwapProblem((btScalar **)CONCAT44(in_stack_ffffffffffffff64,1),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff5c,in_RDI[1]),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff54,in_ESI),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff4c,in_RDI[3]),
                (btScalar *)CONCAT44(in_stack_ffffffffffffff44,*in_RDI),
                *(btScalar **)(in_RDI + 0x1e),in_RDI,
                (bool *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                (int *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
  iVar1 = in_RDI[3];
  *(int *)(*(long *)(in_RDI + 0x22) + (long)iVar1 * 4) = iVar1;
  in_RDI[4] = in_RDI[4] + -1;
  in_RDI[3] = iVar1 + 1;
  return;
}

Assistant:

void btLCP::transfer_i_from_N_to_C (int i)
{
  {
    if (m_nC > 0) {
      {
        btScalar *const aptr = BTAROW(i);
        btScalar *Dell = m_Dell;
        const int *C = m_C;
#   ifdef BTNUB_OPTIMIZATIONS
        // if nub>0, initial part of aptr unpermuted
        const int nub = m_nub;
        int j=0;
        for ( ; j<nub; ++j) Dell[j] = aptr[j];
        const int nC = m_nC;
        for ( ; j<nC; ++j) Dell[j] = aptr[C[j]];
#   else
        const int nC = m_nC;
        for (int j=0; j<nC; ++j) Dell[j] = aptr[C[j]];
#   endif
      }
      btSolveL1 (m_L,m_Dell,m_nC,m_nskip);
      {
        const int nC = m_nC;
        btScalar *const Ltgt = m_L + nC*m_nskip;
        btScalar *ell = m_ell, *Dell = m_Dell, *d = m_d;
        for (int j=0; j<nC; ++j) Ltgt[j] = ell[j] = Dell[j] * d[j];
      }
      const int nC = m_nC;
      m_d[nC] = btRecip (BTAROW(i)[i] - btLargeDot(m_ell,m_Dell,nC));
    }
    else {
      m_d[0] = btRecip (BTAROW(i)[i]);
    }

    btSwapProblem (m_A,m_x,m_b,m_w,m_lo,m_hi,m_p,m_state,m_findex,m_n,m_nC,i,m_nskip,1);

    const int nC = m_nC;
    m_C[nC] = nC;
    m_nN--;
    m_nC = nC + 1; // nC value is outdated after this line
  }

  // @@@ TO DO LATER
  // if we just finish here then we'll go back and re-solve for
  // delta_x. but actually we can be more efficient and incrementally
  // update delta_x here. but if we do this, we wont have ell and Dell
  // to use in updating the factorization later.

}